

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.cpp
# Opt level: O1

void __thiscall
ot::commissioner::ProxyClient::ProxyClient
          (ProxyClient *this,CommissionerImpl *aCommissioner,CoapSecure *aBrClient)

{
  this->mCommissioner = aCommissioner;
  *(undefined8 *)&(this->mEndpoint).super_Endpoint.mReceiver.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->mEndpoint).super_Endpoint.mReceiver.super__Function_base._M_functor + 8) = 0;
  (this->mEndpoint).super_Endpoint.mReceiver.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mEndpoint).super_Endpoint.mReceiver._M_invoker = (_Invoker_type)0x0;
  (this->mEndpoint).super_Endpoint._vptr_Endpoint = (_func_int **)&PTR__ProxyEndpoint_002b9df0;
  (this->mEndpoint).mBrClient = aBrClient;
  (this->mEndpoint).mPeerAddr.mBytes.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->mEndpoint).mPeerAddr.mBytes.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->mEndpoint).mPeerAddr.mBytes.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->mEndpoint).mPeerAddr.mBytes.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  coap::Coap::Coap(&this->mCoap,aCommissioner->mEventBase,&(this->mEndpoint).super_Endpoint);
  (this->mMeshLocalPrefix).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mMeshLocalPrefix).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mMeshLocalPrefix).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ProxyClient::ProxyClient(CommissionerImpl &aCommissioner, coap::CoapSecure &aBrClient)
    : mCommissioner(aCommissioner)
    , mEndpoint(aBrClient)
    , mCoap(aCommissioner.GetEventBase(), mEndpoint)
{
}